

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O0

string * embree::supportedTargetList_abi_cxx11_(int features)

{
  bool bVar1;
  int in_ESI;
  string *in_RDI;
  string *v;
  
  std::__cxx11::string::string((string *)in_RDI);
  bVar1 = hasISA(in_ESI,0x2000001);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE ");
  }
  bVar1 = hasISA(in_ESI,0x2000003);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE2 ");
  }
  bVar1 = hasISA(in_ESI,0x2000007);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE3 ");
  }
  bVar1 = hasISA(in_ESI,0x200000f);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSSE3 ");
  }
  bVar1 = hasISA(in_ESI,0x200001f);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE4.1 ");
  }
  bVar1 = hasISA(in_ESI,0x200007f);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"SSE4.2 ");
  }
  bVar1 = hasISA(in_ESI,0x60000ff);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX ");
  }
  bVar1 = hasISA(in_ESI,0x60001ff);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVXI ");
  }
  bVar1 = hasISA(in_ESI,0x6007dff);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX2 ");
  }
  bVar1 = hasISA(in_ESI,0xe737dff);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"AVX512 ");
  }
  bVar1 = hasISA(in_ESI,0x10000003);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"NEON ");
  }
  bVar1 = hasISA(in_ESI,0x26007dff);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)in_RDI,"2xNEON ");
  }
  return in_RDI;
}

Assistant:

std::string supportedTargetList (int features)
  {
    std::string v;
    if (hasISA(features,SSE)) v += "SSE ";
    if (hasISA(features,SSE2)) v += "SSE2 ";
    if (hasISA(features,SSE3)) v += "SSE3 ";
    if (hasISA(features,SSSE3)) v += "SSSE3 ";
    if (hasISA(features,SSE41)) v += "SSE4.1 ";
    if (hasISA(features,SSE42)) v += "SSE4.2 ";
    if (hasISA(features,AVX)) v += "AVX ";
    if (hasISA(features,AVXI)) v += "AVXI ";
    if (hasISA(features,AVX2)) v += "AVX2 ";
    if (hasISA(features,AVX512)) v += "AVX512 ";

    if (hasISA(features,NEON)) v += "NEON ";
    if (hasISA(features,NEON_2X)) v += "2xNEON ";
    return v;
  }